

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t * container_mutable_unwrap_shared(container_t *c,uint8_t *type)

{
  uint8_t *type_local;
  container_t *c_local;
  container_t *local_8;
  
  local_8 = c;
  if (*type == '\x04') {
    *type = *(uint8_t *)((long)c + 8);
    local_8 = *c;
  }
  return local_8;
}

Assistant:

static inline container_t *container_mutable_unwrap_shared(container_t *c,
                                                           uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {  // the passed in container is shared
        *type = CAST_shared(c)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return CAST_shared(c)->container;  // return the enclosed container
    } else {
        return c;  // wasn't shared, so return as-is
    }
}